

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_must(lysc_ctx *ctx,lysp_restr *must_p,lysc_must *must)

{
  ly_ctx *ctx_00;
  lyxp_expr *value;
  LY_ERR LVar1;
  size_t value_len;
  void *local_e0;
  char *local_c0;
  char *local_b0;
  char *local_98;
  char *local_88;
  void *local_68;
  void *local_60;
  long *local_48;
  char *p__;
  uint64_t __u;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_VALUE_FORMAT format;
  LY_ERR ret;
  lysc_must *must_local;
  lysp_restr *must_p_local;
  lysc_ctx *ctx_local;
  
  ret__ = LY_SUCCESS;
  _format = must;
  must_local = (lysc_must *)must_p;
  must_p_local = (lysp_restr *)ctx;
  LVar1 = lyxp_expr_parse(ctx->ctx,(must_p->arg).str,0,'\x01',&must->cond);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  ctx_00 = (ly_ctx *)(must_p_local->arg).str;
  value = must_local->cond;
  value_len = strlen((char *)must_local->cond);
  LVar1 = lyplg_type_prefix_data_new
                    (ctx_00,value,value_len,LY_VALUE_SCHEMA,must_local->prefixes,&ret___1,
                     &_format->prefixes);
  if (LVar1 == LY_SUCCESS) {
    ret__ = lydict_dup((ly_ctx *)(must_p_local->arg).str,must_local->emsg,&_format->eapptag);
    if ((((ret__ == LY_SUCCESS) &&
         (ret__ = lydict_dup((ly_ctx *)(must_p_local->arg).str,must_local->ref,&_format->emsg),
         ret__ == LY_SUCCESS)) &&
        (ret__ = lydict_dup((ly_ctx *)(must_p_local->arg).str,must_local->eapptag,&_format->dsc),
        ret__ == LY_SUCCESS)) &&
       ((ret__ = lydict_dup((ly_ctx *)(must_p_local->arg).str,(char *)must_local->exts,&_format->ref
                           ), ret__ == LY_SUCCESS && (must_local[1].cond != (lyxp_expr *)0x0)))) {
      if (_format->exts == (lysc_ext_instance *)0x0) {
        local_68 = (void *)0x0;
      }
      else {
        if (_format->exts == (lysc_ext_instance *)0x0) {
          local_60 = (void *)0x0;
        }
        else {
          local_60 = _format->exts[-1].compiled;
        }
        local_68 = local_60;
      }
      if (_format->exts == (lysc_ext_instance *)0x0) {
        if (must_local[1].cond == (lyxp_expr *)0x0) {
          local_98 = (char *)0x0;
        }
        else {
          local_98 = must_local[1].cond[-1].expr;
        }
        local_48 = (long *)calloc(1,(long)((long)local_68 + (long)local_98) * 0x48 + 8);
        if (local_48 == (long *)0x0) {
          ly_log((ly_ctx *)(must_p_local->arg).str,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_must");
          return LY_EMEM;
        }
      }
      else {
        if (must_local[1].cond == (lyxp_expr *)0x0) {
          local_88 = (char *)0x0;
        }
        else {
          local_88 = must_local[1].cond[-1].expr;
        }
        local_48 = (long *)realloc(&_format->exts[-1].compiled,
                                   (long)((long)_format->exts[-1].compiled +
                                         (long)((long)local_68 + (long)local_88)) * 0x48 + 8);
        if (local_48 == (long *)0x0) {
          ly_log((ly_ctx *)(must_p_local->arg).str,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lys_compile_must");
          return LY_EMEM;
        }
      }
      _format->exts = (lysc_ext_instance *)(local_48 + 1);
      if (_format->exts != (lysc_ext_instance *)0x0) {
        if (must_local[1].cond == (lyxp_expr *)0x0) {
          local_b0 = (char *)0x0;
        }
        else {
          local_b0 = must_local[1].cond[-1].expr;
        }
        memset(_format->exts + *local_48,0,(long)((long)local_68 + (long)local_b0) * 0x48);
      }
      p__ = (char *)0x0;
      while( true ) {
        if (must_local[1].cond == (lyxp_expr *)0x0) {
          local_c0 = (char *)0x0;
        }
        else {
          local_c0 = must_local[1].cond[-1].expr;
        }
        if (local_c0 <= p__) break;
        _format->exts[-1].compiled = (void *)((long)_format->exts[-1].compiled + 1);
        if (_format->exts == (lysc_ext_instance *)0x0) {
          local_e0 = (void *)0x0;
        }
        else {
          local_e0 = _format->exts[-1].compiled;
        }
        ret__ = lys_compile_ext((lysc_ctx *)must_p_local,
                                (lysp_ext_instance *)((long)must_local[1].cond + (long)p__ * 0x70),
                                _format->exts + (long)local_e0 + -1,_format);
        if (ret__ == LY_ENOT) {
          _format->exts[-1].compiled = (void *)((long)_format->exts[-1].compiled + -1);
          ret__ = LY_SUCCESS;
        }
        else if (ret__ != LY_SUCCESS) {
          return ret__;
        }
        p__ = p__ + 1;
      }
    }
    return ret__;
  }
  return LVar1;
}

Assistant:

LY_ERR
lys_compile_must(struct lysc_ctx *ctx, const struct lysp_restr *must_p, struct lysc_must *must)
{
    LY_ERR ret = LY_SUCCESS;
    LY_VALUE_FORMAT format;

    LY_CHECK_RET(lyxp_expr_parse(ctx->ctx, must_p->arg.str, 0, 1, &must->cond));
    LY_CHECK_RET(lyplg_type_prefix_data_new(ctx->ctx, must_p->arg.str, strlen(must_p->arg.str),
            LY_VALUE_SCHEMA, must_p->arg.mod, &format, (void **)&must->prefixes));
    DUP_STRING_GOTO(ctx->ctx, must_p->eapptag, must->eapptag, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->emsg, must->emsg, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->dsc, must->dsc, ret, done);
    DUP_STRING_GOTO(ctx->ctx, must_p->ref, must->ref, ret, done);
    COMPILE_EXTS_GOTO(ctx, must_p->exts, must->exts, must, ret, done);

done:
    return ret;
}